

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGeometry.h
# Opt level: O2

ChMatrix33<double> *
chrono::utils::CalcBoxGyration
          (ChMatrix33<double> *__return_storage_ptr__,ChVector<double> *hdims,ChVector<double> *pos,
          ChQuaternion<double> *rot)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)__return_storage_ptr__);
  dVar1 = hdims->m_data[2];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dVar1;
  dVar2 = hdims->m_data[1];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = dVar2;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar1 * dVar1;
  auVar3 = vfmadd231sd_fma(auVar6,auVar3,auVar3);
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar3._0_8_ * 0.3333333333333333;
  dVar1 = hdims->m_data[0];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar1;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = dVar2 * dVar2;
  auVar3 = vfmadd231sd_fma(auVar4,auVar7,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar1 * dVar1;
  auVar4 = vfmadd231sd_fma(auVar8,auVar5,auVar5);
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar4._0_8_ * 0.3333333333333333;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       auVar3._0_8_ * 0.3333333333333333;
  return __return_storage_ptr__;
}

Assistant:

inline ChMatrix33<> CalcBoxGyration(const ChVector<>& hdims,
                                    const ChVector<>& pos = ChVector<>(0, 0, 0),
                                    const ChQuaternion<>& rot = ChQuaternion<>(1, 0, 0, 0)) {
    ChMatrix33<> J;
    J.setZero();
    J(0, 0) = (1.0 / 3.0) * (hdims.y() * hdims.y() + hdims.z() * hdims.z());
    J(1, 1) = (1.0 / 3.0) * (hdims.z() * hdims.z() + hdims.x() * hdims.x());
    J(2, 2) = (1.0 / 3.0) * (hdims.x() * hdims.x() + hdims.y() * hdims.y());

    TransformGyration(J, pos, rot);

    return J;
}